

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<int>::Decompose_LU(TPZMatrix<int> *this)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int nn;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  bVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar2) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar2 == 0) {
    local_40 = (this->super_TPZBaseMatrix).fRow;
    lVar5 = (this->super_TPZBaseMatrix).fCol;
    if (lVar5 < local_40) {
      local_40 = lVar5;
    }
    if (0 < local_40) {
      lVar5 = 0;
      do {
        local_50 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                             (this,lVar5,lVar5);
        if (local_50 == 0) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar6 = lVar5 + 1;
        lVar7 = lVar6;
        if (lVar6 < (this->super_TPZBaseMatrix).fRow) {
          do {
            local_38 = lVar7;
            local_48 = lVar5;
            lVar7 = local_38;
            lVar5 = local_48;
            local_54 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                 (this,lVar6,local_48);
            local_54 = local_54 / local_50;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar6,lVar5,&local_54);
            if (lVar7 < (this->super_TPZBaseMatrix).fCol) {
              do {
                iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar6,lVar7);
                iVar1 = local_54;
                iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,local_48,lVar7);
                local_4c = iVar3 - iVar4 * iVar1;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar6,lVar7,&local_4c);
                lVar7 = lVar7 + 1;
              } while (lVar7 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar6 = lVar6 + 1;
            lVar7 = local_38;
            lVar5 = local_48;
          } while (lVar6 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar5 = lVar7;
      } while (lVar7 != local_40);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}